

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void Commands::ReloadMap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  Map *pMVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  const_reference subject;
  reference ppMVar5;
  mapped_type *this;
  Map *this_00;
  Map *local_70;
  int local_68;
  int newmapid;
  allocator<char> local_51;
  key_type local_50;
  int local_30;
  byte local_29;
  int mapid;
  bool isnew;
  Map *map;
  World *world;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  world = (World *)from;
  from_local = (Character *)arguments;
  iVar2 = (*(from->super_Command_Source)._vptr_Command_Source[4])();
  map = (Map *)CONCAT44(extraout_var,iVar2);
  _mapid = (Map *)(world->formulas_cache)._M_h._M_element_count;
  local_29 = 0;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)from_local);
  if (sVar4 != 0) {
    subject = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)from_local,0);
    local_30 = util::to_int(subject);
    if (local_30 < 1) {
      local_30 = 1;
    }
    sVar4 = std::vector<Map_*,_std::allocator<Map_*>_>::size
                      ((vector<Map_*,_std::allocator<Map_*>_> *)
                       &map[5].tiles.super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    iVar2 = local_30;
    if ((ulong)(long)(local_30 + -1) < sVar4) {
      ppMVar5 = std::vector<Map_*,_std::allocator<Map_*>_>::operator[]
                          ((vector<Map_*,_std::allocator<Map_*>_> *)
                           &map[5].tiles.super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_30 + -1))
      ;
      _mapid = *ppMVar5;
    }
    else {
      pMVar1 = map + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Maps",&local_51);
      this = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           *)((long)&(pMVar1->jukebox_player).field_2 + 8),&local_50);
      iVar3 = util::variant::operator_cast_to_int(this);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      if (iVar2 <= iVar3) {
        local_29 = 1;
        while (sVar4 = std::vector<Map_*,_std::allocator<Map_*>_>::size
                                 ((vector<Map_*,_std::allocator<Map_*>_> *)
                                  &map[5].tiles.
                                   super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage),
              sVar4 < (ulong)(long)local_30) {
          sVar4 = std::vector<Map_*,_std::allocator<Map_*>_>::size
                            ((vector<Map_*,_std::allocator<Map_*>_> *)
                             &map[5].tiles.super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_68 = (int)sVar4 + 1;
          pMVar1 = map + 5;
          this_00 = (Map *)operator_new(0xd8);
          Map::Map(this_00,local_68,(World *)map);
          local_70 = this_00;
          std::vector<Map_*,_std::allocator<Map_*>_>::push_back
                    ((vector<Map_*,_std::allocator<Map_*>_> *)
                     &(pMVar1->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_70);
        }
      }
    }
  }
  if ((_mapid != (Map *)0x0) && ((local_29 & 1) == 0)) {
    Map::Reload(_mapid);
  }
  return;
}

Assistant:

void ReloadMap(const std::vector<std::string>& arguments, Character* from)
{
	World* world = from->SourceWorld();
	Map* map = from->map;
	bool isnew = false;

	if (arguments.size() >= 1)
	{
		int mapid = util::to_int(arguments[0]);

		if (mapid < 1)
			mapid = 1;

		if (world->maps.size() > mapid - 1)
		{
			map = world->maps[mapid - 1];
		}
		else if (mapid <= static_cast<int>(world->config["Maps"]))
		{
			isnew = true;

			while (world->maps.size() < mapid)
			{
				int newmapid = world->maps.size() + 1;
				world->maps.push_back(new Map(newmapid, world));
			}
		}
	}

	if (map && !isnew)
	{
		map->Reload();
	}
}